

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserUpdateView.cpp
# Opt level: O2

void __thiscall UserUpdateView::display(UserUpdateView *this)

{
  ModelForm<BaseUser> *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  Application *this_01;
  BaseUser *pBVar4;
  UserCreateUpdateForm *this_02;
  undefined4 extraout_var;
  Controller *pCVar5;
  View *pVVar6;
  string *this_03;
  string email;
  string password;
  string lastName;
  string firstName;
  BaseUser loggedInUser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  BaseUser local_110;
  
  this_01 = Application::getInstance();
  pBVar4 = Application::getCurrentUser(this_01);
  local_110.super_Model<BaseUser>.id = (pBVar4->super_Model<BaseUser>).id;
  local_110.super_Model<BaseUser>._vptr_Model = (_func_int **)&PTR_save_0012bc88;
  memcpy(&local_110.super_Model<BaseUser>.field_0xc,&(pBVar4->super_Model<BaseUser>).field_0xc,0xe1)
  ;
  std::operator<<((ostream *)&std::cout,"To update a user fill in the details asked below: \n");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_170.field_2._M_local_buf[0] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  bVar1 = BaseUser::isAdmin(&local_110);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Email: ");
    Input::getEmail_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    BaseUser::getEmail(&local_110);
    std::__cxx11::string::assign((char *)&local_1b0);
  }
  std::operator<<((ostream *)&std::cout,"First name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator<<((ostream *)&std::cout,"Last name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator<<((ostream *)&std::cout,"Password: ");
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = BaseUser::isAdmin(&local_110);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Should this user be an admin? (y/n): ");
    cVar2 = Input::getChar();
    bVar1 = cVar2 == 'y';
  }
  else {
    bVar1 = false;
  }
  pBVar4 = BaseUser::findByEmail(&local_1b0);
  if (pBVar4 == (BaseUser *)0x0) {
    std::operator+(&local_1d0,"A user with ",&local_1b0);
    std::operator+(&local_1f0,&local_1d0," email address doesn\'t exist.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    this_03 = &local_1d0;
  }
  else {
    this_02 = (UserCreateUpdateForm *)operator_new(0xb0);
    UserCreateUpdateForm::UserCreateUpdateForm
              (this_02,&local_150,&local_170,&local_1b0,&local_190,bVar1,pBVar4);
    (this->super_UpdateView<BaseUser>).form = (ModelForm<BaseUser> *)this_02;
    bVar1 = Form::isValid((Form *)this_02);
    this_00 = (this->super_UpdateView<BaseUser>).form;
    if (!bVar1) {
      Form::printErrors(&this_00->super_Form);
      goto LAB_00109180;
    }
    iVar3 = (*(this_00->super_Form)._vptr_Form[1])();
    BaseUser::getFullName_abi_cxx11_(&local_130,(BaseUser *)CONCAT44(extraout_var,iVar3));
    std::operator+(&local_1d0,"User ",&local_130);
    std::operator+(&local_1f0,&local_1d0," updated successfully.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_03 = &local_130;
  }
  std::__cxx11::string::~string((string *)this_03);
LAB_00109180:
  bVar1 = BaseUser::isAdmin(&local_110);
  if (bVar1) {
    pCVar5 = Controller::getInstance();
    std::__cxx11::string::string((string *)&local_1f0,"admin-panel",(allocator *)&local_1d0);
    pVVar6 = Controller::getView(pCVar5,&local_1f0);
  }
  else {
    pCVar5 = Controller::getInstance();
    std::__cxx11::string::string((string *)&local_1f0,"faculty-panel",(allocator *)&local_1d0);
    pVVar6 = Controller::getView(pCVar5,&local_1f0);
  }
  View::response->view = pVVar6;
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void UserUpdateView::display() {
    BaseUser loggedInUser = *Application::getInstance().getCurrentUser();
    cout << "To update a user fill in the details asked below: \n";
    string email, firstName, lastName, password;
    bool adminStatus;
    if (loggedInUser.isAdmin()) {
        cout << "Email: ";
        email = Input::getEmail();
    } else {
        email = loggedInUser.getEmail();
    }
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Password: ";
    password = Input::getPassword();
    if (loggedInUser.isAdmin()) {
        cout << "Should this user be an admin? (y/n): ";
        adminStatus = (Input::getChar() == 'y');
    } else adminStatus = false;
    BaseUser *user = BaseUser::findByEmail(email);
    if (user) {
        form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus, user);
        if (form->isValid()) {
            user = &form->save();
            cout << "User " + user->getFullName() + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "A user with " + email + " email address doesn't exist.\n";
    }
    response->view = loggedInUser.isAdmin() ? Controller::getInstance().getView("admin-panel")
                                            : Controller::getInstance().getView("faculty-panel");
}